

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O3

void TestStringToDoubleOctalString(void)

{
  char *pcVar1;
  undefined8 uVar2;
  char *pcVar3;
  double dVar4;
  undefined8 uVar5;
  bool all_used;
  int processed;
  bool local_5;
  int local_4;
  
  dVar4 = StrToD("012",0x3a,0.0,&local_4,&local_5,0);
  if ((dVar4 != 10.0) || (NAN(dVar4))) {
    pcVar1 = "10.0";
    pcVar3 = "StrToD(\"012\", flags, 0.0, &processed, &all_used)";
    uVar5 = 0x4024000000000000;
    uVar2 = 0xb38;
LAB_0084ad39:
    printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %.30e\n#  Found:    %.30e\n",uVar5,dVar4,
           "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-conversions.cc"
           ,uVar2,pcVar1,pcVar3);
    abort();
  }
  if (local_5 == false) {
    uVar2 = 0xb39;
LAB_0084a911:
    printf("%s:%d:\n CHECK(%s) failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-conversions.cc"
           ,uVar2,"all_used");
    abort();
  }
  dVar4 = StrToD("00",0x3a,1.0,&local_4,&local_5,0);
  uVar5 = 0;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    pcVar1 = "0.0";
    pcVar3 = "StrToD(\"00\", flags, 1.0, &processed, &all_used)";
    uVar2 = 0xb3b;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb3c;
    goto LAB_0084a911;
  }
  dVar4 = StrToD("012",0x3a,1.0,&local_4,&local_5,0);
  if ((dVar4 != 10.0) || (NAN(dVar4))) {
    pcVar1 = "10.0";
    pcVar3 = "StrToD(\"012\", flags, 1.0, &processed, &all_used)";
    uVar5 = 0x4024000000000000;
    uVar2 = 0xb3e;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb3f;
    goto LAB_0084a911;
  }
  dVar4 = StrToD("0123456789",0x3a,NAN,&local_4,&local_5,0);
  if ((dVar4 != 123456789.0) || (NAN(dVar4))) {
    pcVar1 = "123456789.0";
    pcVar3 = "StrToD(\"0123456789\", flags, Double::NaN(), &processed, &all_used)";
    uVar5 = 0x419d6f3454000000;
    uVar2 = 0xb42;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb43;
    goto LAB_0084a911;
  }
  dVar4 = StrToD("01234567",0x3a,NAN,&local_4,&local_5,0);
  if ((dVar4 != 342391.0) || (NAN(dVar4))) {
    pcVar1 = "342391.0";
    pcVar3 = "StrToD(\"01234567\", flags, Double::NaN(), &processed, &all_used)";
    uVar5 = 0x4114e5dc00000000;
    uVar2 = 0xb46;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb47;
    goto LAB_0084a911;
  }
  dVar4 = StrToD("+01234567",0x3a,NAN,&local_4,&local_5,0);
  if ((dVar4 != 342391.0) || (NAN(dVar4))) {
    pcVar1 = "342391.0";
    pcVar3 = "StrToD(\"+01234567\", flags, Double::NaN(), &processed, &all_used)";
    uVar5 = 0x4114e5dc00000000;
    uVar2 = 0xb4a;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb4b;
    goto LAB_0084a911;
  }
  dVar4 = StrToD("-01234567",0x3a,NAN,&local_4,&local_5,0);
  if ((dVar4 != -342391.0) || (NAN(dVar4))) {
    pcVar1 = "-342391.0";
    pcVar3 = "StrToD(\"-01234567\", flags, Double::NaN(), &processed, &all_used)";
    uVar5 = 0xc114e5dc00000000;
    uVar2 = 0xb4e;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb4f;
    goto LAB_0084a911;
  }
  dVar4 = StrToD(" 012",0x3a,0.0,&local_4,&local_5,0);
  if ((dVar4 != 10.0) || (NAN(dVar4))) {
    pcVar1 = "10.0";
    pcVar3 = "StrToD(\" 012\", flags, 0.0, &processed, &all_used)";
    uVar5 = 0x4024000000000000;
    uVar2 = 0xb51;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb52;
    goto LAB_0084a911;
  }
  dVar4 = StrToD("\n012",0x3a,0.0,&local_4,&local_5,0);
  if ((dVar4 != 10.0) || (NAN(dVar4))) {
    pcVar1 = "10.0";
    pcVar3 = "StrToD(\"\\n012\", flags, 0.0, &processed, &all_used)";
    uVar5 = 0x4024000000000000;
    uVar2 = 0xb54;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb55;
    goto LAB_0084a911;
  }
  dVar4 = StrToD(" 00",0x3a,1.0,&local_4,&local_5,0);
  uVar5 = 0;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    pcVar1 = "0.0";
    pcVar3 = "StrToD(\" 00\", flags, 1.0, &processed, &all_used)";
    uVar2 = 0xb57;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb58;
    goto LAB_0084a911;
  }
  dVar4 = StrToD("\t00",0x3a,1.0,&local_4,&local_5,0);
  uVar5 = 0;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    pcVar1 = "0.0";
    pcVar3 = "StrToD(\"\\t00\", flags, 1.0, &processed, &all_used)";
    uVar2 = 0xb5a;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb5b;
    goto LAB_0084a911;
  }
  dVar4 = StrToD(" 012",0x3a,1.0,&local_4,&local_5,0);
  if ((dVar4 != 10.0) || (NAN(dVar4))) {
    pcVar1 = "10.0";
    pcVar3 = "StrToD(\" 012\", flags, 1.0, &processed, &all_used)";
    uVar5 = 0x4024000000000000;
    uVar2 = 0xb5d;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb5e;
    goto LAB_0084a911;
  }
  dVar4 = StrToD("\n012",0x3a,1.0,&local_4,&local_5,0);
  if ((dVar4 != 10.0) || (NAN(dVar4))) {
    pcVar1 = "10.0";
    pcVar3 = "StrToD(\"\\n012\", flags, 1.0, &processed, &all_used)";
    uVar5 = 0x4024000000000000;
    uVar2 = 0xb60;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb61;
    goto LAB_0084a911;
  }
  dVar4 = StrToD(" 0123456789",0x3a,NAN,&local_4,&local_5,0);
  if ((dVar4 != 123456789.0) || (NAN(dVar4))) {
    pcVar1 = "123456789.0";
    pcVar3 = "StrToD(\" 0123456789\", flags, Double::NaN(), &processed, &all_used)";
    uVar5 = 0x419d6f3454000000;
    uVar2 = 0xb64;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb65;
    goto LAB_0084a911;
  }
  dVar4 = StrToD(" 01234567",0x3a,NAN,&local_4,&local_5,0);
  if ((dVar4 != 342391.0) || (NAN(dVar4))) {
    pcVar1 = "342391.0";
    pcVar3 = "StrToD(\" 01234567\", flags, Double::NaN(), &processed, &all_used)";
    uVar5 = 0x4114e5dc00000000;
    uVar2 = 0xb68;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb69;
    goto LAB_0084a911;
  }
  dVar4 = StrToD("\n01234567",0x3a,NAN,&local_4,&local_5,0);
  if ((dVar4 != 342391.0) || (NAN(dVar4))) {
    pcVar1 = "342391.0";
    pcVar3 = "StrToD(\"\\n01234567\", flags, Double::NaN(), &processed, &all_used)";
    uVar5 = 0x4114e5dc00000000;
    uVar2 = 0xb6c;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb6d;
    goto LAB_0084a911;
  }
  dVar4 = StrToD(" + 01234567",0x3a,NAN,&local_4,&local_5,0);
  if ((dVar4 != 342391.0) || (NAN(dVar4))) {
    pcVar1 = "342391.0";
    pcVar3 = "StrToD(\" + 01234567\", flags, Double::NaN(), &processed, &all_used)";
    uVar5 = 0x4114e5dc00000000;
    uVar2 = 0xb70;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb71;
    goto LAB_0084a911;
  }
  dVar4 = StrToD(" - 01234567",0x3a,NAN,&local_4,&local_5,0);
  if ((dVar4 != -342391.0) || (NAN(dVar4))) {
    pcVar1 = "-342391.0";
    pcVar3 = "StrToD(\" - 01234567\", flags, Double::NaN(), &processed, &all_used)";
    uVar5 = 0xc114e5dc00000000;
    uVar2 = 0xb74;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb75;
    goto LAB_0084a911;
  }
  dVar4 = StrToD("\n-\t01234567",0x3a,NAN,&local_4,&local_5,0);
  if ((dVar4 != -342391.0) || (NAN(dVar4))) {
    pcVar1 = "-342391.0";
    pcVar3 = "StrToD(\"\\n-\\t01234567\", flags, Double::NaN(), &processed, &all_used)";
    uVar5 = 0xc114e5dc00000000;
    uVar2 = 0xb78;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb79;
    goto LAB_0084a911;
  }
  dVar4 = StrToD(" 012 ",0x3a,0.0,&local_4,&local_5,0);
  if ((dVar4 != 10.0) || (NAN(dVar4))) {
    pcVar1 = "10.0";
    pcVar3 = "StrToD(\" 012 \", flags, 0.0, &processed, &all_used)";
    uVar5 = 0x4024000000000000;
    uVar2 = 0xb7b;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb7c;
    goto LAB_0084a911;
  }
  dVar4 = StrToD(" 00 ",0x3a,1.0,&local_4,&local_5,0);
  uVar5 = 0;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    pcVar1 = "0.0";
    pcVar3 = "StrToD(\" 00 \", flags, 1.0, &processed, &all_used)";
    uVar2 = 0xb7e;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb7f;
    goto LAB_0084a911;
  }
  dVar4 = StrToD(" 012 ",0x3a,1.0,&local_4,&local_5,0);
  if ((dVar4 != 10.0) || (NAN(dVar4))) {
    pcVar1 = "10.0";
    pcVar3 = "StrToD(\" 012 \", flags, 1.0, &processed, &all_used)";
    uVar5 = 0x4024000000000000;
    uVar2 = 0xb81;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb82;
    goto LAB_0084a911;
  }
  dVar4 = StrToD(" 0123456789 ",0x3a,NAN,&local_4,&local_5,0);
  if ((dVar4 != 123456789.0) || (NAN(dVar4))) {
    pcVar1 = "123456789.0";
    pcVar3 = "StrToD(\" 0123456789 \", flags, Double::NaN(), &processed, &all_used)";
    uVar5 = 0x419d6f3454000000;
    uVar2 = 0xb85;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb86;
    goto LAB_0084a911;
  }
  dVar4 = StrToD(" 01234567 ",0x3a,NAN,&local_4,&local_5,0);
  if ((dVar4 != 342391.0) || (NAN(dVar4))) {
    pcVar1 = "342391.0";
    pcVar3 = "StrToD(\" 01234567 \", flags, Double::NaN(), &processed, &all_used)";
    uVar5 = 0x4114e5dc00000000;
    uVar2 = 0xb89;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb8a;
    goto LAB_0084a911;
  }
  dVar4 = StrToD(" + 01234567 ",0x3a,NAN,&local_4,&local_5,0);
  if ((dVar4 != 342391.0) || (NAN(dVar4))) {
    pcVar1 = "342391.0";
    pcVar3 = "StrToD(\" + 01234567 \", flags, Double::NaN(), &processed, &all_used)";
    uVar5 = 0x4114e5dc00000000;
    uVar2 = 0xb8d;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb8e;
    goto LAB_0084a911;
  }
  dVar4 = StrToD(" - 01234567 ",0x3a,NAN,&local_4,&local_5,0);
  if ((dVar4 != -342391.0) || (NAN(dVar4))) {
    pcVar1 = "-342391.0";
    pcVar3 = "StrToD(\" - 01234567 \", flags, Double::NaN(), &processed, &all_used)";
    uVar5 = 0xc114e5dc00000000;
    uVar2 = 0xb91;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb92;
    goto LAB_0084a911;
  }
  dVar4 = StrToD("012 ",0x3a,0.0,&local_4,&local_5,0);
  if ((dVar4 != 10.0) || (NAN(dVar4))) {
    pcVar1 = "10.0";
    pcVar3 = "StrToD(\"012 \", flags, 0.0, &processed, &all_used)";
    uVar5 = 0x4024000000000000;
    uVar2 = 0xb94;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb95;
    goto LAB_0084a911;
  }
  dVar4 = StrToD("00 ",0x3a,1.0,&local_4,&local_5,0);
  uVar5 = 0;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    pcVar1 = "0.0";
    pcVar3 = "StrToD(\"00 \", flags, 1.0, &processed, &all_used)";
    uVar2 = 0xb97;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb98;
    goto LAB_0084a911;
  }
  dVar4 = StrToD("012 ",0x3a,1.0,&local_4,&local_5,0);
  if ((dVar4 != 10.0) || (NAN(dVar4))) {
    pcVar1 = "10.0";
    pcVar3 = "StrToD(\"012 \", flags, 1.0, &processed, &all_used)";
    uVar5 = 0x4024000000000000;
    uVar2 = 0xb9a;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb9b;
    goto LAB_0084a911;
  }
  dVar4 = StrToD("0123456789 ",0x3a,NAN,&local_4,&local_5,0);
  if ((dVar4 != 123456789.0) || (NAN(dVar4))) {
    pcVar1 = "123456789.0";
    pcVar3 = "StrToD(\"0123456789 \", flags, Double::NaN(), &processed, &all_used)";
    uVar5 = 0x419d6f3454000000;
    uVar2 = 0xb9e;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xb9f;
    goto LAB_0084a911;
  }
  dVar4 = StrToD("01234567 ",0x3a,NAN,&local_4,&local_5,0);
  if ((dVar4 != 342391.0) || (NAN(dVar4))) {
    pcVar1 = "342391.0";
    pcVar3 = "StrToD(\"01234567 \", flags, Double::NaN(), &processed, &all_used)";
    uVar5 = 0x4114e5dc00000000;
    uVar2 = 0xba2;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xba3;
    goto LAB_0084a911;
  }
  dVar4 = StrToD("+01234567",0x3a,NAN,&local_4,&local_5,0);
  if ((dVar4 != 342391.0) || (NAN(dVar4))) {
    pcVar1 = "342391.0";
    pcVar3 = "StrToD(\"+01234567\", flags, Double::NaN(), &processed, &all_used)";
    uVar5 = 0x4114e5dc00000000;
    uVar2 = 0xba6;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xba7;
    goto LAB_0084a911;
  }
  dVar4 = StrToD("-01234567",0x3a,NAN,&local_4,&local_5,0);
  if ((dVar4 != -342391.0) || (NAN(dVar4))) {
    pcVar1 = "-342391.0";
    pcVar3 = "StrToD(\"-01234567\", flags, Double::NaN(), &processed, &all_used)";
    uVar5 = 0xc114e5dc00000000;
    uVar2 = 0xbaa;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xbab;
    goto LAB_0084a911;
  }
  dVar4 = StrToD("01234567e0",0x3a,NAN,&local_4,&local_5,0);
  if (!NAN(dVar4)) {
    pcVar1 = "Double::NaN()";
    pcVar3 = "StrToD(\"01234567e0\", flags, Double::NaN(), &processed, &all_used)";
    uVar5 = 0x7ff8000000000000;
    uVar2 = 0xbae;
    goto LAB_0084ad39;
  }
  if (local_4 != 0) {
    uVar2 = 0xbaf;
    goto LAB_0084a730;
  }
  dVar4 = StrToD("012",2,0.0,&local_4,&local_5,0);
  if ((dVar4 != 10.0) || (NAN(dVar4))) {
    pcVar1 = "10.0";
    pcVar3 = "StrToD(\"012\", flags, 0.0, &processed, &all_used)";
    uVar5 = 0x4024000000000000;
    uVar2 = 0xbb3;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xbb4;
    goto LAB_0084a911;
  }
  dVar4 = StrToD("00",2,1.0,&local_4,&local_5,0);
  uVar5 = 0;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    pcVar1 = "0.0";
    pcVar3 = "StrToD(\"00\", flags, 1.0, &processed, &all_used)";
    uVar2 = 0xbb6;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 2999;
    goto LAB_0084a911;
  }
  dVar4 = StrToD("012",2,1.0,&local_4,&local_5,0);
  if ((dVar4 != 10.0) || (NAN(dVar4))) {
    pcVar1 = "10.0";
    pcVar3 = "StrToD(\"012\", flags, 1.0, &processed, &all_used)";
    uVar5 = 0x4024000000000000;
    uVar2 = 0xbb9;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xbba;
    goto LAB_0084a911;
  }
  dVar4 = StrToD("0123456789",2,NAN,&local_4,&local_5,0);
  if ((dVar4 != 123456789.0) || (NAN(dVar4))) {
    pcVar1 = "123456789.0";
    pcVar3 = "StrToD(\"0123456789\", flags, Double::NaN(), &processed, &all_used)";
    uVar5 = 0x419d6f3454000000;
    uVar2 = 0xbbd;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xbbe;
    goto LAB_0084a911;
  }
  dVar4 = StrToD("01234567",2,NAN,&local_4,&local_5,0);
  if ((dVar4 != 342391.0) || (NAN(dVar4))) {
    pcVar1 = "342391.0";
    pcVar3 = "StrToD(\"01234567\", flags, Double::NaN(), &processed, &all_used)";
    uVar5 = 0x4114e5dc00000000;
    uVar2 = 0xbc1;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xbc2;
    goto LAB_0084a911;
  }
  dVar4 = StrToD("+01234567",2,NAN,&local_4,&local_5,0);
  if ((dVar4 != 342391.0) || (NAN(dVar4))) {
    pcVar1 = "342391.0";
    pcVar3 = "StrToD(\"+01234567\", flags, Double::NaN(), &processed, &all_used)";
    uVar5 = 0x4114e5dc00000000;
    uVar2 = 0xbc5;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xbc6;
    goto LAB_0084a911;
  }
  dVar4 = StrToD("-01234567",2,NAN,&local_4,&local_5,0);
  if ((dVar4 != -342391.0) || (NAN(dVar4))) {
    pcVar1 = "-342391.0";
    pcVar3 = "StrToD(\"-01234567\", flags, Double::NaN(), &processed, &all_used)";
    uVar5 = 0xc114e5dc00000000;
    uVar2 = 0xbc9;
    goto LAB_0084ad39;
  }
  if (local_5 == false) {
    uVar2 = 0xbca;
    goto LAB_0084a911;
  }
  dVar4 = StrToD(" 012",2,0.0,&local_4,&local_5,0);
  if (!NAN(dVar4)) {
    pcVar1 = "Double::NaN()";
    pcVar3 = "StrToD(\" 012\", flags, 0.0, &processed, &all_used)";
    uVar5 = 0x7ff8000000000000;
    uVar2 = 0xbcc;
    goto LAB_0084ad39;
  }
  if (local_4 == 0) {
    dVar4 = StrToD(" 00",2,1.0,&local_4,&local_5,0);
    if (!NAN(dVar4)) {
      pcVar1 = "Double::NaN()";
      pcVar3 = "StrToD(\" 00\", flags, 1.0, &processed, &all_used)";
      uVar5 = 0x7ff8000000000000;
      uVar2 = 0xbcf;
      goto LAB_0084ad39;
    }
    if (local_4 == 0) {
      dVar4 = StrToD(" 012",2,1.0,&local_4,&local_5,0);
      if (!NAN(dVar4)) {
        pcVar1 = "Double::NaN()";
        pcVar3 = "StrToD(\" 012\", flags, 1.0, &processed, &all_used)";
        uVar5 = 0x7ff8000000000000;
        uVar2 = 0xbd2;
        goto LAB_0084ad39;
      }
      if (local_4 == 0) {
        dVar4 = StrToD(" 0123456789",2,NAN,&local_4,&local_5,0);
        if (!NAN(dVar4)) {
          pcVar1 = "Double::NaN()";
          pcVar3 = "StrToD(\" 0123456789\", flags, Double::NaN(), &processed, &all_used)";
          uVar5 = 0x7ff8000000000000;
          uVar2 = 0xbd6;
          goto LAB_0084ad39;
        }
        if (local_4 == 0) {
          dVar4 = StrToD(" 01234567",2,NAN,&local_4,&local_5,0);
          if (!NAN(dVar4)) {
            pcVar1 = "Double::NaN()";
            pcVar3 = "StrToD(\" 01234567\", flags, Double::NaN(), &processed, &all_used)";
            uVar5 = 0x7ff8000000000000;
            uVar2 = 0xbda;
            goto LAB_0084ad39;
          }
          if (local_4 == 0) {
            dVar4 = StrToD(" + 01234567",2,NAN,&local_4,&local_5,0);
            if (!NAN(dVar4)) {
              pcVar1 = "Double::NaN()";
              pcVar3 = "StrToD(\" + 01234567\", flags, Double::NaN(), &processed, &all_used)";
              uVar5 = 0x7ff8000000000000;
              uVar2 = 0xbde;
              goto LAB_0084ad39;
            }
            if (local_4 == 0) {
              dVar4 = StrToD(" - 01234567",2,NAN,&local_4,&local_5,0);
              if (!NAN(dVar4)) {
                pcVar1 = "Double::NaN()";
                pcVar3 = "StrToD(\" - 01234567\", flags, Double::NaN(), &processed, &all_used)";
                uVar5 = 0x7ff8000000000000;
                uVar2 = 0xbe2;
                goto LAB_0084ad39;
              }
              if (local_4 == 0) {
                dVar4 = StrToD(" 012 ",2,0.0,&local_4,&local_5,0);
                if (!NAN(dVar4)) {
                  pcVar1 = "Double::NaN()";
                  pcVar3 = "StrToD(\" 012 \", flags, 0.0, &processed, &all_used)";
                  uVar5 = 0x7ff8000000000000;
                  uVar2 = 0xbe5;
                  goto LAB_0084ad39;
                }
                if (local_4 == 0) {
                  dVar4 = StrToD(" 00 ",2,1.0,&local_4,&local_5,0);
                  if (!NAN(dVar4)) {
                    pcVar1 = "Double::NaN()";
                    pcVar3 = "StrToD(\" 00 \", flags, 1.0, &processed, &all_used)";
                    uVar5 = 0x7ff8000000000000;
                    uVar2 = 0xbe8;
                    goto LAB_0084ad39;
                  }
                  if (local_4 == 0) {
                    dVar4 = StrToD(" 012 ",2,1.0,&local_4,&local_5,0);
                    if (!NAN(dVar4)) {
                      pcVar1 = "Double::NaN()";
                      pcVar3 = "StrToD(\" 012 \", flags, 1.0, &processed, &all_used)";
                      uVar5 = 0x7ff8000000000000;
                      uVar2 = 0xbeb;
                      goto LAB_0084ad39;
                    }
                    if (local_4 == 0) {
                      dVar4 = StrToD(" 0123456789 ",2,NAN,&local_4,&local_5,0);
                      if (!NAN(dVar4)) {
                        pcVar1 = "Double::NaN()";
                        pcVar3 = 
                        "StrToD(\" 0123456789 \", flags, Double::NaN(), &processed, &all_used)";
                        uVar5 = 0x7ff8000000000000;
                        uVar2 = 0xbef;
                        goto LAB_0084ad39;
                      }
                      if (local_4 == 0) {
                        dVar4 = StrToD(" 01234567 ",2,NAN,&local_4,&local_5,0);
                        if (!NAN(dVar4)) {
                          pcVar1 = "Double::NaN()";
                          pcVar3 = 
                          "StrToD(\" 01234567 \", flags, Double::NaN(), &processed, &all_used)";
                          uVar5 = 0x7ff8000000000000;
                          uVar2 = 0xbf3;
                          goto LAB_0084ad39;
                        }
                        if (local_4 == 0) {
                          dVar4 = StrToD(" + 01234567 ",2,NAN,&local_4,&local_5,0);
                          if (!NAN(dVar4)) {
                            pcVar1 = "Double::NaN()";
                            pcVar3 = 
                            "StrToD(\" + 01234567 \", flags, Double::NaN(), &processed, &all_used)";
                            uVar5 = 0x7ff8000000000000;
                            uVar2 = 0xbf7;
                            goto LAB_0084ad39;
                          }
                          if (local_4 == 0) {
                            dVar4 = StrToD(" - 01234567 ",2,NAN,&local_4,&local_5,0);
                            if (!NAN(dVar4)) {
                              pcVar1 = "Double::NaN()";
                              pcVar3 = 
                              "StrToD(\" - 01234567 \", flags, Double::NaN(), &processed, &all_used)"
                              ;
                              uVar5 = 0x7ff8000000000000;
                              uVar2 = 0xbfb;
                              goto LAB_0084ad39;
                            }
                            if (local_4 == 0) {
                              dVar4 = StrToD("012 ",2,0.0,&local_4,&local_5,0);
                              if (!NAN(dVar4)) {
                                pcVar1 = "Double::NaN()";
                                pcVar3 = "StrToD(\"012 \", flags, 0.0, &processed, &all_used)";
                                uVar5 = 0x7ff8000000000000;
                                uVar2 = 0xbfe;
                                goto LAB_0084ad39;
                              }
                              if (local_4 == 0) {
                                dVar4 = StrToD("00 ",2,1.0,&local_4,&local_5,0);
                                if (!NAN(dVar4)) {
                                  pcVar1 = "Double::NaN()";
                                  pcVar3 = "StrToD(\"00 \", flags, 1.0, &processed, &all_used)";
                                  uVar5 = 0x7ff8000000000000;
                                  uVar2 = 0xc01;
                                  goto LAB_0084ad39;
                                }
                                if (local_4 == 0) {
                                  dVar4 = StrToD("012 ",2,1.0,&local_4,&local_5,0);
                                  if (!NAN(dVar4)) {
                                    pcVar1 = "Double::NaN()";
                                    pcVar3 = "StrToD(\"012 \", flags, 1.0, &processed, &all_used)";
                                    uVar5 = 0x7ff8000000000000;
                                    uVar2 = 0xc04;
                                    goto LAB_0084ad39;
                                  }
                                  if (local_4 == 0) {
                                    dVar4 = StrToD("0123456789 ",2,NAN,&local_4,&local_5,0);
                                    if (!NAN(dVar4)) {
                                      pcVar1 = "Double::NaN()";
                                      pcVar3 = 
                                      "StrToD(\"0123456789 \", flags, Double::NaN(), &processed, &all_used)"
                                      ;
                                      uVar5 = 0x7ff8000000000000;
                                      uVar2 = 0xc08;
                                      goto LAB_0084ad39;
                                    }
                                    if (local_4 == 0) {
                                      dVar4 = StrToD("01234567 ",2,NAN,&local_4,&local_5,0);
                                      if (!NAN(dVar4)) {
                                        pcVar1 = "Double::NaN()";
                                        pcVar3 = 
                                        "StrToD(\"01234567 \", flags, Double::NaN(), &processed, &all_used)"
                                        ;
                                        uVar5 = 0x7ff8000000000000;
                                        uVar2 = 0xc0c;
                                        goto LAB_0084ad39;
                                      }
                                      if (local_4 == 0) {
                                        dVar4 = StrToD("+01234567",2,NAN,&local_4,&local_5,0);
                                        if ((dVar4 != 342391.0) || (NAN(dVar4))) {
                                          pcVar1 = "342391.0";
                                          pcVar3 = 
                                          "StrToD(\"+01234567\", flags, Double::NaN(), &processed, &all_used)"
                                          ;
                                          uVar5 = 0x4114e5dc00000000;
                                          uVar2 = 0xc10;
                                          goto LAB_0084ad39;
                                        }
                                        if (local_5 == false) {
                                          uVar2 = 0xc11;
                                          goto LAB_0084a911;
                                        }
                                        dVar4 = StrToD("-01234567",2,NAN,&local_4,&local_5,0);
                                        if ((dVar4 != -342391.0) || (NAN(dVar4))) {
                                          pcVar1 = "-342391.0";
                                          pcVar3 = 
                                          "StrToD(\"-01234567\", flags, Double::NaN(), &processed, &all_used)"
                                          ;
                                          uVar5 = 0xc114e5dc00000000;
                                          uVar2 = 0xc14;
                                          goto LAB_0084ad39;
                                        }
                                        if (local_5 == false) {
                                          uVar2 = 0xc15;
                                          goto LAB_0084a911;
                                        }
                                        dVar4 = StrToD("01234567e0",2,NAN,&local_4,&local_5,0);
                                        if (!NAN(dVar4)) {
                                          pcVar1 = "Double::NaN()";
                                          pcVar3 = 
                                          "StrToD(\"01234567e0\", flags, Double::NaN(), &processed, &all_used)"
                                          ;
                                          uVar5 = 0x7ff8000000000000;
                                          uVar2 = 0xc18;
                                          goto LAB_0084ad39;
                                        }
                                        if (local_4 != 0) {
                                          uVar2 = 0xc19;
                                          goto LAB_0084a730;
                                        }
                                        dVar4 = StrToD("012",6,0.0,&local_4,&local_5,0);
                                        if ((dVar4 != 10.0) || (NAN(dVar4))) {
                                          pcVar1 = "10.0";
                                          pcVar3 = 
                                          "StrToD(\"012\", flags, 0.0, &processed, &all_used)";
                                          uVar5 = 0x4024000000000000;
                                          uVar2 = 0xc1e;
                                          goto LAB_0084ad39;
                                        }
                                        if (local_5 == false) {
                                          uVar2 = 0xc1f;
                                          goto LAB_0084a911;
                                        }
                                        dVar4 = StrToD("00",6,1.0,&local_4,&local_5,0);
                                        uVar5 = 0;
                                        if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                          pcVar1 = "0.0";
                                          pcVar3 = 
                                          "StrToD(\"00\", flags, 1.0, &processed, &all_used)";
                                          uVar2 = 0xc21;
                                          goto LAB_0084ad39;
                                        }
                                        if (local_5 == false) {
                                          uVar2 = 0xc22;
                                          goto LAB_0084a911;
                                        }
                                        dVar4 = StrToD("012",6,1.0,&local_4,&local_5,0);
                                        if ((dVar4 != 10.0) || (NAN(dVar4))) {
                                          pcVar1 = "10.0";
                                          pcVar3 = 
                                          "StrToD(\"012\", flags, 1.0, &processed, &all_used)";
                                          uVar5 = 0x4024000000000000;
                                          uVar2 = 0xc24;
                                          goto LAB_0084ad39;
                                        }
                                        if (local_5 == false) {
                                          uVar2 = 0xc25;
                                          goto LAB_0084a911;
                                        }
                                        dVar4 = StrToD("0123456789",6,NAN,&local_4,&local_5,0);
                                        if ((dVar4 != 123456789.0) || (NAN(dVar4))) {
                                          pcVar1 = "123456789.0";
                                          pcVar3 = 
                                          "StrToD(\"0123456789\", flags, Double::NaN(), &processed, &all_used)"
                                          ;
                                          uVar5 = 0x419d6f3454000000;
                                          uVar2 = 0xc28;
                                          goto LAB_0084ad39;
                                        }
                                        if (local_5 == false) {
                                          uVar2 = 0xc29;
                                          goto LAB_0084a911;
                                        }
                                        dVar4 = StrToD("01234567",6,NAN,&local_4,&local_5,0);
                                        if ((dVar4 != 342391.0) || (NAN(dVar4))) {
                                          pcVar1 = "342391.0";
                                          pcVar3 = 
                                          "StrToD(\"01234567\", flags, Double::NaN(), &processed, &all_used)"
                                          ;
                                          uVar5 = 0x4114e5dc00000000;
                                          uVar2 = 0xc2c;
                                          goto LAB_0084ad39;
                                        }
                                        if (local_5 == false) {
                                          uVar2 = 0xc2d;
                                          goto LAB_0084a911;
                                        }
                                        dVar4 = StrToD("+01234567",6,NAN,&local_4,&local_5,0);
                                        if ((dVar4 != 342391.0) || (NAN(dVar4))) {
                                          pcVar1 = "342391.0";
                                          pcVar3 = 
                                          "StrToD(\"+01234567\", flags, Double::NaN(), &processed, &all_used)"
                                          ;
                                          uVar5 = 0x4114e5dc00000000;
                                          uVar2 = 0xc30;
                                          goto LAB_0084ad39;
                                        }
                                        if (local_5 == false) {
                                          uVar2 = 0xc31;
                                          goto LAB_0084a911;
                                        }
                                        dVar4 = StrToD("-01234567",6,NAN,&local_4,&local_5,0);
                                        if ((dVar4 != -342391.0) || (NAN(dVar4))) {
                                          pcVar1 = "-342391.0";
                                          pcVar3 = 
                                          "StrToD(\"-01234567\", flags, Double::NaN(), &processed, &all_used)"
                                          ;
                                          uVar5 = 0xc114e5dc00000000;
                                          uVar2 = 0xc34;
                                          goto LAB_0084ad39;
                                        }
                                        if (local_5 == false) {
                                          uVar2 = 0xc35;
                                          goto LAB_0084a911;
                                        }
                                        dVar4 = StrToD(" 012",6,0.0,&local_4,&local_5,0);
                                        if (!NAN(dVar4)) {
                                          pcVar1 = "Double::NaN()";
                                          pcVar3 = 
                                          "StrToD(\" 012\", flags, 0.0, &processed, &all_used)";
                                          uVar5 = 0x7ff8000000000000;
                                          uVar2 = 0xc37;
                                          goto LAB_0084ad39;
                                        }
                                        if (local_4 == 0) {
                                          dVar4 = StrToD(" 00",6,1.0,&local_4,&local_5,0);
                                          if (!NAN(dVar4)) {
                                            pcVar1 = "Double::NaN()";
                                            pcVar3 = 
                                            "StrToD(\" 00\", flags, 1.0, &processed, &all_used)";
                                            uVar5 = 0x7ff8000000000000;
                                            uVar2 = 0xc3a;
                                            goto LAB_0084ad39;
                                          }
                                          if (local_4 == 0) {
                                            dVar4 = StrToD(" 012",6,1.0,&local_4,&local_5,0);
                                            if (!NAN(dVar4)) {
                                              pcVar1 = "Double::NaN()";
                                              pcVar3 = 
                                              "StrToD(\" 012\", flags, 1.0, &processed, &all_used)";
                                              uVar5 = 0x7ff8000000000000;
                                              uVar2 = 0xc3d;
                                              goto LAB_0084ad39;
                                            }
                                            if (local_4 == 0) {
                                              dVar4 = StrToD(" 0123456789",6,NAN,&local_4,&local_5,0
                                                            );
                                              if (!NAN(dVar4)) {
                                                pcVar1 = "Double::NaN()";
                                                pcVar3 = 
                                                "StrToD(\" 0123456789\", flags, Double::NaN(), &processed, &all_used)"
                                                ;
                                                uVar5 = 0x7ff8000000000000;
                                                uVar2 = 0xc41;
                                                goto LAB_0084ad39;
                                              }
                                              if (local_4 == 0) {
                                                dVar4 = StrToD(" 01234567",6,NAN,&local_4,&local_5,0
                                                              );
                                                if (!NAN(dVar4)) {
                                                  pcVar1 = "Double::NaN()";
                                                  pcVar3 = 
                                                  "StrToD(\" 01234567\", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xc45;
                                                  goto LAB_0084ad39;
                                                }
                                                if (local_4 == 0) {
                                                  dVar4 = StrToD(" + 01234567",6,NAN,&local_4,
                                                                 &local_5,0);
                                                  if (!NAN(dVar4)) {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\" + 01234567\", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xc49;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToD(" - 01234567",6,NAN,&local_4,
                                                                   &local_5,0);
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\" - 01234567\", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xc4d;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToD(" 012 ",6,0.0,&local_4,&local_5,0
                                                                  );
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\" 012 \", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xc50;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToD(" 00 ",6,1.0,&local_4,&local_5,0)
                                                    ;
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\" 00 \", flags, 1.0, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xc53;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToD(" 012 ",6,1.0,&local_4,&local_5,0
                                                                  );
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\" 012 \", flags, 1.0, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xc56;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToD(" 0123456789 ",6,NAN,&local_4,
                                                                   &local_5,0);
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\" 0123456789 \", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xc5a;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToD(" 01234567 ",6,NAN,&local_4,
                                                                   &local_5,0);
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\" 01234567 \", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xc5e;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToD(" + 01234567 ",6,NAN,&local_4,
                                                                   &local_5,0);
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\" + 01234567 \", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xc62;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToD(" - 01234567 ",6,NAN,&local_4,
                                                                   &local_5,0);
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\" - 01234567 \", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xc66;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToD("012 ",6,0.0,&local_4,&local_5,0)
                                                    ;
                                                    if ((dVar4 != 10.0) || (NAN(dVar4))) {
                                                      pcVar1 = "10.0";
                                                      pcVar3 = 
                                                  "StrToD(\"012 \", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4024000000000000;
                                                  uVar2 = 0xc69;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 != 3) {
                                                    uVar2 = 0xc6a;
LAB_0084abea:
                                                    pcVar1 = "3";
                                                    uVar5 = 3;
                                                    goto LAB_0084a733;
                                                  }
                                                  dVar4 = StrToD("00 ",6,1.0,&local_4,&local_5,0);
                                                  uVar5 = 0;
                                                  if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                    pcVar1 = "0.0";
                                                    pcVar3 = 
                                                  "StrToD(\"00 \", flags, 1.0, &processed, &all_used)"
                                                  ;
                                                  uVar2 = 0xc6c;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 != 2) {
                                                    uVar2 = 0xc6d;
LAB_0084a9c2:
                                                    pcVar1 = "2";
                                                    uVar5 = 2;
                                                    goto LAB_0084a733;
                                                  }
                                                  dVar4 = StrToD("0123456789 ",6,NAN,&local_4,
                                                                 &local_5,0);
                                                  if ((dVar4 != 123456789.0) || (NAN(dVar4))) {
                                                    pcVar1 = "123456789.0";
                                                    pcVar3 = 
                                                  "StrToD(\"0123456789 \", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x419d6f3454000000;
                                                  uVar2 = 0xc70;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 != 10) {
                                                    uVar2 = 0xc71;
LAB_0084ad69:
                                                    pcVar1 = "10";
                                                    uVar5 = 10;
                                                    goto LAB_0084a733;
                                                  }
                                                  dVar4 = StrToD("01234567 ",6,NAN,&local_4,&local_5
                                                                 ,0);
                                                  if ((dVar4 != 342391.0) || (NAN(dVar4))) {
                                                    pcVar1 = "342391.0";
                                                    pcVar3 = 
                                                  "StrToD(\"01234567 \", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4114e5dc00000000;
                                                  uVar2 = 0xc74;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 != 8) {
                                                    uVar2 = 0xc75;
                                                    goto LAB_0084aa7e;
                                                  }
                                                  dVar4 = StrToD("+01234567",6,NAN,&local_4,&local_5
                                                                 ,0);
                                                  if ((dVar4 != 342391.0) || (NAN(dVar4))) {
                                                    pcVar1 = "342391.0";
                                                    pcVar3 = 
                                                  "StrToD(\"+01234567\", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4114e5dc00000000;
                                                  uVar2 = 0xc78;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0xc79;
                                                    goto LAB_0084a911;
                                                  }
                                                  dVar4 = StrToD("-01234567",6,NAN,&local_4,&local_5
                                                                 ,0);
                                                  if ((dVar4 != -342391.0) || (NAN(dVar4))) {
                                                    pcVar1 = "-342391.0";
                                                    pcVar3 = 
                                                  "StrToD(\"-01234567\", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0xc114e5dc00000000;
                                                  uVar2 = 0xc7c;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0xc7d;
                                                    goto LAB_0084a911;
                                                  }
                                                  dVar4 = StrToD("012foo ",6,0.0,&local_4,&local_5,0
                                                                );
                                                  if ((dVar4 != 10.0) || (NAN(dVar4))) {
                                                    pcVar1 = "10.0";
                                                    pcVar3 = 
                                                  "StrToD(\"012foo \", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4024000000000000;
                                                  uVar2 = 0xc7f;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 != 3) {
                                                    uVar2 = 0xc80;
                                                    goto LAB_0084abea;
                                                  }
                                                  dVar4 = StrToD("00foo ",6,1.0,&local_4,&local_5,0)
                                                  ;
                                                  uVar5 = 0;
                                                  if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                    pcVar1 = "0.0";
                                                    pcVar3 = 
                                                  "StrToD(\"00foo \", flags, 1.0, &processed, &all_used)"
                                                  ;
                                                  uVar2 = 0xc82;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 != 2) {
                                                    uVar2 = 0xc83;
                                                    goto LAB_0084a9c2;
                                                  }
                                                  dVar4 = StrToD("0123456789foo ",6,NAN,&local_4,
                                                                 &local_5,0);
                                                  if ((dVar4 != 123456789.0) || (NAN(dVar4))) {
                                                    pcVar1 = "123456789.0";
                                                    pcVar3 = 
                                                  "StrToD(\"0123456789foo \", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x419d6f3454000000;
                                                  uVar2 = 0xc87;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 != 10) {
                                                    uVar2 = 0xc88;
                                                    goto LAB_0084ad69;
                                                  }
                                                  dVar4 = StrToD("01234567foo ",6,NAN,&local_4,
                                                                 &local_5,0);
                                                  if ((dVar4 != 342391.0) || (NAN(dVar4))) {
                                                    pcVar1 = "342391.0";
                                                    pcVar3 = 
                                                  "StrToD(\"01234567foo \", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4114e5dc00000000;
                                                  uVar2 = 0xc8b;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 != 8) {
                                                    uVar2 = 0xc8c;
                                                    goto LAB_0084aa7e;
                                                  }
                                                  dVar4 = StrToD("+01234567foo",6,NAN,&local_4,
                                                                 &local_5,0);
                                                  if ((dVar4 != 342391.0) || (NAN(dVar4))) {
                                                    pcVar1 = "342391.0";
                                                    pcVar3 = 
                                                  "StrToD(\"+01234567foo\", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4114e5dc00000000;
                                                  uVar2 = 0xc8f;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 9) {
                                                    dVar4 = StrToD("-01234567foo",6,NAN,&local_4,
                                                                   &local_5,0);
                                                    if ((dVar4 != -342391.0) || (NAN(dVar4))) {
                                                      pcVar1 = "-342391.0";
                                                      pcVar3 = 
                                                  "StrToD(\"-01234567foo\", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0xc114e5dc00000000;
                                                  uVar2 = 0xc93;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 9) {
                                                    dVar4 = StrToD("012 foo ",6,0.0,&local_4,
                                                                   &local_5,0);
                                                    if ((dVar4 != 10.0) || (NAN(dVar4))) {
                                                      pcVar1 = "10.0";
                                                      pcVar3 = 
                                                  "StrToD(\"012 foo \", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4024000000000000;
                                                  uVar2 = 0xc96;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 != 3) {
                                                    uVar2 = 0xc97;
                                                    goto LAB_0084abea;
                                                  }
                                                  dVar4 = StrToD("00 foo ",6,1.0,&local_4,&local_5,0
                                                                );
                                                  uVar5 = 0;
                                                  if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                    pcVar1 = "0.0";
                                                    pcVar3 = 
                                                  "StrToD(\"00 foo \", flags, 1.0, &processed, &all_used)"
                                                  ;
                                                  uVar2 = 0xc99;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 != 2) {
                                                    uVar2 = 0xc9a;
                                                    goto LAB_0084a9c2;
                                                  }
                                                  dVar4 = StrToD("0123456789 foo ",6,NAN,&local_4,
                                                                 &local_5,0);
                                                  if ((dVar4 != 123456789.0) || (NAN(dVar4))) {
                                                    pcVar1 = "123456789.0";
                                                    pcVar3 = 
                                                  "StrToD(\"0123456789 foo \", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x419d6f3454000000;
                                                  uVar2 = 0xc9e;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 != 10) {
                                                    uVar2 = 0xc9f;
                                                    goto LAB_0084ad69;
                                                  }
                                                  dVar4 = StrToD("01234567 foo ",6,NAN,&local_4,
                                                                 &local_5,0);
                                                  if ((dVar4 != 342391.0) || (NAN(dVar4))) {
                                                    pcVar1 = "342391.0";
                                                    pcVar3 = 
                                                  "StrToD(\"01234567 foo \", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4114e5dc00000000;
                                                  uVar2 = 0xca3;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 != 8) {
                                                    uVar2 = 0xca4;
LAB_0084aa7e:
                                                    pcVar1 = "8";
                                                    uVar5 = 8;
                                                    goto LAB_0084a733;
                                                  }
                                                  dVar4 = StrToD("+01234567 foo",6,NAN,&local_4,
                                                                 &local_5,0);
                                                  if ((dVar4 != 342391.0) || (NAN(dVar4))) {
                                                    pcVar1 = "342391.0";
                                                    pcVar3 = 
                                                  "StrToD(\"+01234567 foo\", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4114e5dc00000000;
                                                  uVar2 = 0xca8;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 9) {
                                                    dVar4 = StrToD("-01234567 foo",6,NAN,&local_4,
                                                                   &local_5,0);
                                                    if ((dVar4 != -342391.0) || (NAN(dVar4))) {
                                                      pcVar1 = "-342391.0";
                                                      pcVar3 = 
                                                  "StrToD(\"-01234567 foo\", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0xc114e5dc00000000;
                                                  uVar2 = 0xcad;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 9) {
                                                    dVar4 = StrToD("01234567e0",6,NAN,&local_4,
                                                                   &local_5,0);
                                                    if ((dVar4 != 342391.0) || (NAN(dVar4))) {
                                                      pcVar1 = "342391.0";
                                                      pcVar3 = 
                                                  "StrToD(\"01234567e0\", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4114e5dc00000000;
                                                  uVar2 = 0xcb1;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 8) {
                                                    dVar4 = StrToD("01234567e",6,NAN,&local_4,
                                                                   &local_5,0);
                                                    if ((dVar4 != 342391.0) || (NAN(dVar4))) {
                                                      pcVar1 = "342391.0";
                                                      pcVar3 = 
                                                  "StrToD(\"01234567e\", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4114e5dc00000000;
                                                  uVar2 = 0xcb5;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 8) {
                                                    dVar4 = StrToD("012",0x16,0.0,&local_4,&local_5,
                                                                   0);
                                                    if ((dVar4 != 10.0) || (NAN(dVar4))) {
                                                      pcVar1 = "10.0";
                                                      pcVar3 = 
                                                  "StrToD(\"012\", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4024000000000000;
                                                  uVar2 = 0xcbb;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0xcbc;
                                                    goto LAB_0084a911;
                                                  }
                                                  dVar4 = StrToD("00",0x16,1.0,&local_4,&local_5,0);
                                                  uVar5 = 0;
                                                  if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                    pcVar1 = "0.0";
                                                    pcVar3 = 
                                                  "StrToD(\"00\", flags, 1.0, &processed, &all_used)"
                                                  ;
                                                  uVar2 = 0xcbe;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0xcbf;
                                                    goto LAB_0084a911;
                                                  }
                                                  dVar4 = StrToD("012",0x16,1.0,&local_4,&local_5,0)
                                                  ;
                                                  if ((dVar4 != 10.0) || (NAN(dVar4))) {
                                                    pcVar1 = "10.0";
                                                    pcVar3 = 
                                                  "StrToD(\"012\", flags, 1.0, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4024000000000000;
                                                  uVar2 = 0xcc1;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0xcc2;
                                                    goto LAB_0084a911;
                                                  }
                                                  dVar4 = StrToD("0123456789",0x16,NAN,&local_4,
                                                                 &local_5,0);
                                                  if ((dVar4 != 123456789.0) || (NAN(dVar4))) {
                                                    pcVar1 = "123456789.0";
                                                    pcVar3 = 
                                                  "StrToD(\"0123456789\", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x419d6f3454000000;
                                                  uVar2 = 0xcc5;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0xcc6;
                                                    goto LAB_0084a911;
                                                  }
                                                  dVar4 = StrToD("01234567",0x16,NAN,&local_4,
                                                                 &local_5,0);
                                                  if ((dVar4 != 342391.0) || (NAN(dVar4))) {
                                                    pcVar1 = "342391.0";
                                                    pcVar3 = 
                                                  "StrToD(\"01234567\", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4114e5dc00000000;
                                                  uVar2 = 0xcc9;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0xcca;
                                                    goto LAB_0084a911;
                                                  }
                                                  dVar4 = StrToD("+01234567",0x16,NAN,&local_4,
                                                                 &local_5,0);
                                                  if ((dVar4 != 342391.0) || (NAN(dVar4))) {
                                                    pcVar1 = "342391.0";
                                                    pcVar3 = 
                                                  "StrToD(\"+01234567\", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4114e5dc00000000;
                                                  uVar2 = 0xccd;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0xcce;
                                                    goto LAB_0084a911;
                                                  }
                                                  dVar4 = StrToD("-01234567",0x16,NAN,&local_4,
                                                                 &local_5,0);
                                                  if ((dVar4 != -342391.0) || (NAN(dVar4))) {
                                                    pcVar1 = "-342391.0";
                                                    pcVar3 = 
                                                  "StrToD(\"-01234567\", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0xc114e5dc00000000;
                                                  uVar2 = 0xcd1;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0xcd2;
                                                    goto LAB_0084a911;
                                                  }
                                                  dVar4 = StrToD(" 012",0x16,0.0,&local_4,&local_5,0
                                                                );
                                                  if (!NAN(dVar4)) {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToD(\" 012\", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xcd4;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToD(" 00",0x16,1.0,&local_4,&local_5,
                                                                   0);
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\" 00\", flags, 1.0, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xcd7;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToD(" 012",0x16,1.0,&local_4,&local_5
                                                                   ,0);
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\" 012\", flags, 1.0, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xcda;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToD(" 0123456789",0x16,NAN,&local_4,
                                                                   &local_5,0);
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\" 0123456789\", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xcde;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToD(" 01234567",0x16,NAN,&local_4,
                                                                   &local_5,0);
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\" 01234567\", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xce2;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToD(" + 01234567",0x16,NAN,&local_4,
                                                                   &local_5,0);
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\" + 01234567\", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xce6;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToD(" - 01234567",0x16,NAN,&local_4,
                                                                   &local_5,0);
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\" - 01234567\", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xcea;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToD(" 012 ",0x16,0.0,&local_4,
                                                                   &local_5,0);
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\" 012 \", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xced;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToD(" 00 ",0x16,1.0,&local_4,&local_5
                                                                   ,0);
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\" 00 \", flags, 1.0, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xcf0;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToD(" 012 ",0x16,1.0,&local_4,
                                                                   &local_5,0);
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\" 012 \", flags, 1.0, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xcf3;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToD(" 0123456789 ",0x16,NAN,&local_4,
                                                                   &local_5,0);
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\" 0123456789 \", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xcf7;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToD(" 01234567 ",0x16,NAN,&local_4,
                                                                   &local_5,0);
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\" 01234567 \", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xcfb;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToD(" + 01234567 ",0x16,NAN,&local_4,
                                                                   &local_5,0);
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\" + 01234567 \", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xcff;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToD(" - 01234567 ",0x16,NAN,&local_4,
                                                                   &local_5,0);
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToD(\" - 01234567 \", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0xd03;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToD("012 ",0x16,0.0,&local_4,&local_5
                                                                   ,0);
                                                    if ((dVar4 != 10.0) || (NAN(dVar4))) {
                                                      pcVar1 = "10.0";
                                                      pcVar3 = 
                                                  "StrToD(\"012 \", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4024000000000000;
                                                  uVar2 = 0xd06;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0xd07;
                                                    goto LAB_0084a911;
                                                  }
                                                  dVar4 = StrToD("00 ",0x16,1.0,&local_4,&local_5,0)
                                                  ;
                                                  uVar5 = 0;
                                                  if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                    pcVar1 = "0.0";
                                                    pcVar3 = 
                                                  "StrToD(\"00 \", flags, 1.0, &processed, &all_used)"
                                                  ;
                                                  uVar2 = 0xd09;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0xd0a;
                                                    goto LAB_0084a911;
                                                  }
                                                  dVar4 = StrToD("0123456789 ",0x16,NAN,&local_4,
                                                                 &local_5,0);
                                                  if ((dVar4 != 123456789.0) || (NAN(dVar4))) {
                                                    pcVar1 = "123456789.0";
                                                    pcVar3 = 
                                                  "StrToD(\"0123456789 \", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x419d6f3454000000;
                                                  uVar2 = 0xd0d;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0xd0e;
                                                    goto LAB_0084a911;
                                                  }
                                                  dVar4 = StrToD("01234567 ",0x16,NAN,&local_4,
                                                                 &local_5,0);
                                                  if ((dVar4 != 342391.0) || (NAN(dVar4))) {
                                                    pcVar1 = "342391.0";
                                                    pcVar3 = 
                                                  "StrToD(\"01234567 \", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4114e5dc00000000;
                                                  uVar2 = 0xd11;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0xd12;
                                                    goto LAB_0084a911;
                                                  }
                                                  dVar4 = StrToD("+01234567",0x16,NAN,&local_4,
                                                                 &local_5,0);
                                                  if ((dVar4 != 342391.0) || (NAN(dVar4))) {
                                                    pcVar1 = "342391.0";
                                                    pcVar3 = 
                                                  "StrToD(\"+01234567\", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4114e5dc00000000;
                                                  uVar2 = 0xd15;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0xd16;
                                                    goto LAB_0084a911;
                                                  }
                                                  dVar4 = StrToD("-01234567",0x16,NAN,&local_4,
                                                                 &local_5,0);
                                                  if ((dVar4 != -342391.0) || (NAN(dVar4))) {
                                                    pcVar1 = "-342391.0";
                                                    pcVar3 = 
                                                  "StrToD(\"-01234567\", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0xc114e5dc00000000;
                                                  uVar2 = 0xd19;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0xd1a;
                                                    goto LAB_0084a911;
                                                  }
                                                  dVar4 = StrToD("012foo ",0x16,0.0,&local_4,
                                                                 &local_5,0);
                                                  if ((dVar4 != 10.0) || (NAN(dVar4))) {
                                                    pcVar1 = "10.0";
                                                    pcVar3 = 
                                                  "StrToD(\"012foo \", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4024000000000000;
                                                  uVar2 = 0xd1c;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 != 3) {
                                                    uVar2 = 0xd1d;
                                                    goto LAB_0084abea;
                                                  }
                                                  dVar4 = StrToD("00foo ",0x16,1.0,&local_4,&local_5
                                                                 ,0);
                                                  uVar5 = 0;
                                                  if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                    pcVar1 = "0.0";
                                                    pcVar3 = 
                                                  "StrToD(\"00foo \", flags, 1.0, &processed, &all_used)"
                                                  ;
                                                  uVar2 = 0xd1f;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 != 2) {
                                                    uVar2 = 0xd20;
                                                    goto LAB_0084a9c2;
                                                  }
                                                  dVar4 = StrToD("0123456789foo ",0x16,NAN,&local_4,
                                                                 &local_5,0);
                                                  if ((dVar4 != 123456789.0) || (NAN(dVar4))) {
                                                    pcVar1 = "123456789.0";
                                                    pcVar3 = 
                                                  "StrToD(\"0123456789foo \", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x419d6f3454000000;
                                                  uVar2 = 0xd24;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 != 10) {
                                                    uVar2 = 0xd25;
                                                    goto LAB_0084ad69;
                                                  }
                                                  dVar4 = StrToD("01234567foo ",0x16,NAN,&local_4,
                                                                 &local_5,0);
                                                  if ((dVar4 != 342391.0) || (NAN(dVar4))) {
                                                    pcVar1 = "342391.0";
                                                    pcVar3 = 
                                                  "StrToD(\"01234567foo \", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4114e5dc00000000;
                                                  uVar2 = 0xd28;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 != 8) {
                                                    uVar2 = 0xd29;
                                                    goto LAB_0084aa7e;
                                                  }
                                                  dVar4 = StrToD("+01234567foo",0x16,NAN,&local_4,
                                                                 &local_5,0);
                                                  if ((dVar4 != 342391.0) || (NAN(dVar4))) {
                                                    pcVar1 = "342391.0";
                                                    pcVar3 = 
                                                  "StrToD(\"+01234567foo\", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4114e5dc00000000;
                                                  uVar2 = 0xd2c;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 9) {
                                                    dVar4 = StrToD("-01234567foo",0x16,NAN,&local_4,
                                                                   &local_5,0);
                                                    if ((dVar4 != -342391.0) || (NAN(dVar4))) {
                                                      pcVar1 = "-342391.0";
                                                      pcVar3 = 
                                                  "StrToD(\"-01234567foo\", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0xc114e5dc00000000;
                                                  uVar2 = 0xd30;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 9) {
                                                    dVar4 = StrToD("012 foo ",0x16,0.0,&local_4,
                                                                   &local_5,0);
                                                    if ((dVar4 != 10.0) || (NAN(dVar4))) {
                                                      pcVar1 = "10.0";
                                                      pcVar3 = 
                                                  "StrToD(\"012 foo \", flags, 0.0, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4024000000000000;
                                                  uVar2 = 0xd33;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 != 4) {
                                                    pcVar1 = "4";
                                                    uVar2 = 0xd34;
                                                    uVar5 = 4;
                                                    goto LAB_0084a733;
                                                  }
                                                  dVar4 = StrToD("00 foo ",0x16,1.0,&local_4,
                                                                 &local_5,0);
                                                  uVar5 = 0;
                                                  if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                    pcVar1 = "0.0";
                                                    pcVar3 = 
                                                  "StrToD(\"00 foo \", flags, 1.0, &processed, &all_used)"
                                                  ;
                                                  uVar2 = 0xd36;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 != 3) {
                                                    uVar2 = 0xd37;
                                                    goto LAB_0084abea;
                                                  }
                                                  dVar4 = StrToD("0123456789 foo ",0x16,NAN,&local_4
                                                                 ,&local_5,0);
                                                  if ((dVar4 != 123456789.0) || (NAN(dVar4))) {
                                                    pcVar1 = "123456789.0";
                                                    pcVar3 = 
                                                  "StrToD(\"0123456789 foo \", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x419d6f3454000000;
                                                  uVar2 = 0xd3b;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 != 0xb) {
                                                    pcVar1 = "11";
                                                    uVar2 = 0xd3c;
                                                    uVar5 = 0xb;
                                                    goto LAB_0084a733;
                                                  }
                                                  dVar4 = StrToD("01234567 foo ",0x16,NAN,&local_4,
                                                                 &local_5,0);
                                                  if ((dVar4 != 342391.0) || (NAN(dVar4))) {
                                                    pcVar1 = "342391.0";
                                                    pcVar3 = 
                                                  "StrToD(\"01234567 foo \", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4114e5dc00000000;
                                                  uVar2 = 0xd40;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 9) {
                                                    dVar4 = StrToD("+01234567 foo",0x16,NAN,&local_4
                                                                   ,&local_5,0);
                                                    if ((dVar4 != 342391.0) || (NAN(dVar4))) {
                                                      pcVar1 = "342391.0";
                                                      pcVar3 = 
                                                  "StrToD(\"+01234567 foo\", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4114e5dc00000000;
                                                  uVar2 = 0xd45;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 10) {
                                                    dVar4 = StrToD("-01234567 foo",0x16,NAN,&local_4
                                                                   ,&local_5,0);
                                                    if ((dVar4 != -342391.0) || (NAN(dVar4))) {
                                                      pcVar1 = "-342391.0";
                                                      pcVar3 = 
                                                  "StrToD(\"-01234567 foo\", flags, Double::NaN(), &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0xc114e5dc00000000;
                                                  uVar2 = 0xd4a;
                                                  goto LAB_0084ad39;
                                                  }
                                                  if (local_4 == 10) {
                                                    return;
                                                  }
                                                  uVar2 = 0xd4b;
                                                  }
                                                  else {
                                                    uVar2 = 0xd46;
                                                  }
                                                  goto LAB_0084ad69;
                                                  }
                                                  uVar2 = 0xd41;
                                                  }
                                                  else {
                                                    uVar2 = 0xd31;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0xd2d;
                                                  }
                                                  goto LAB_0084acac;
                                                  }
                                                  uVar2 = 0xd04;
                                                  }
                                                  else {
                                                    uVar2 = 0xd00;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0xcfc;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0xcf8;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0xcf4;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0xcf1;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0xcee;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0xceb;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0xce7;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0xce3;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0xcdf;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0xcdb;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0xcd8;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0xcd5;
                                                  }
                                                  goto LAB_0084a730;
                                                  }
                                                  uVar2 = 0xcb6;
                                                  }
                                                  else {
                                                    uVar2 = 0xcb2;
                                                  }
                                                  goto LAB_0084aa7e;
                                                  }
                                                  uVar2 = 0xcae;
                                                  }
                                                  else {
                                                    uVar2 = 0xca9;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0xc94;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0xc90;
                                                  }
LAB_0084acac:
                                                  pcVar1 = "9";
                                                  uVar5 = 9;
                                                  goto LAB_0084a733;
                                                  }
                                                  uVar2 = 0xc67;
                                                  }
                                                  else {
                                                    uVar2 = 0xc63;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0xc5f;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0xc5b;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0xc57;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0xc54;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0xc51;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0xc4e;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0xc4a;
                                                  }
                                                }
                                                else {
                                                  uVar2 = 0xc46;
                                                }
                                              }
                                              else {
                                                uVar2 = 0xc42;
                                              }
                                            }
                                            else {
                                              uVar2 = 0xc3e;
                                            }
                                          }
                                          else {
                                            uVar2 = 0xc3b;
                                          }
                                        }
                                        else {
                                          uVar2 = 0xc38;
                                        }
                                      }
                                      else {
                                        uVar2 = 0xc0d;
                                      }
                                    }
                                    else {
                                      uVar2 = 0xc09;
                                    }
                                  }
                                  else {
                                    uVar2 = 0xc05;
                                  }
                                }
                                else {
                                  uVar2 = 0xc02;
                                }
                              }
                              else {
                                uVar2 = 0xbff;
                              }
                            }
                            else {
                              uVar2 = 0xbfc;
                            }
                          }
                          else {
                            uVar2 = 0xbf8;
                          }
                        }
                        else {
                          uVar2 = 0xbf4;
                        }
                      }
                      else {
                        uVar2 = 0xbf0;
                      }
                    }
                    else {
                      uVar2 = 0xbec;
                    }
                  }
                  else {
                    uVar2 = 0xbe9;
                  }
                }
                else {
                  uVar2 = 0xbe6;
                }
              }
              else {
                uVar2 = 0xbe3;
              }
            }
            else {
              uVar2 = 0xbdf;
            }
          }
          else {
            uVar2 = 0xbdb;
          }
        }
        else {
          uVar2 = 0xbd7;
        }
      }
      else {
        uVar2 = 0xbd3;
      }
    }
    else {
      uVar2 = 0xbd0;
    }
  }
  else {
    uVar2 = 0xbcd;
  }
LAB_0084a730:
  pcVar1 = "0";
  uVar5 = 0;
LAB_0084a733:
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",
         "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-conversions.cc"
         ,uVar2,pcVar1,"processed",uVar5,local_4);
  abort();
}

Assistant:

TEST(StringToDoubleOctalString) {
  int flags;
  int processed;
  bool all_used;

  flags = StringToDoubleConverter::ALLOW_OCTALS |
      StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES |
      StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN;

  CHECK_EQ(10.0, StrToD("012", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("00", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("012", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123456789.0,
           StrToD("0123456789", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("+01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("-01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD(" 012", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("\n012", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD(" 00", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("\t00", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD(" 012", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("\n012", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123456789.0,
           StrToD(" 0123456789", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD(" 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("\n01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD(" + 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD(" - 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("\n-\t01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD(" 012 ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD(" 00 ", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD(" 012 ", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123456789.0,
           StrToD(" 0123456789 ", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD(" 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD(" + 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD(" - 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("012 ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("00 ", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("012 ", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123456789.0,
           StrToD("0123456789 ", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("+01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("-01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("01234567e0", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::ALLOW_OCTALS;
  CHECK_EQ(10.0, StrToD("012", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("00", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("012", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123456789.0,
           StrToD("0123456789", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("+01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("-01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD(" 012", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 00", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 0123456789", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" + 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" - 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 00 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 0123456789 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" + 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" - 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("012 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("00 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("012 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0123456789 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(342391.0,
           StrToD("+01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("-01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("01234567e0", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::ALLOW_OCTALS |
      StringToDoubleConverter::ALLOW_TRAILING_JUNK;
  CHECK_EQ(10.0, StrToD("012", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("00", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("012", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123456789.0,
           StrToD("0123456789", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("+01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("-01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD(" 012", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 00", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 0123456789", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" + 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" - 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 00 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 0123456789 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" + 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" - 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(10.0, StrToD("012 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(3, processed);

  CHECK_EQ(0.0, StrToD("00 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(123456789.0,
           StrToD("0123456789 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(10, processed);

  CHECK_EQ(342391.0,
           StrToD("01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(8, processed);

  CHECK_EQ(342391.0,
           StrToD("+01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("-01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("012foo ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(3, processed);

  CHECK_EQ(0.0, StrToD("00foo ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(123456789.0,
           StrToD("0123456789foo ", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(10, processed);

  CHECK_EQ(342391.0,
           StrToD("01234567foo ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(8, processed);

  CHECK_EQ(342391.0,
           StrToD("+01234567foo", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(9, processed);

  CHECK_EQ(-342391.0,
           StrToD("-01234567foo", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(9, processed);

  CHECK_EQ(10.0, StrToD("012 foo ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(3, processed);

  CHECK_EQ(0.0, StrToD("00 foo ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(123456789.0,
           StrToD("0123456789 foo ", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(10, processed);

  CHECK_EQ(342391.0,
           StrToD("01234567 foo ", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(8, processed);

  CHECK_EQ(342391.0,
           StrToD("+01234567 foo", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(9, processed);

  CHECK_EQ(-342391.0,
           StrToD("-01234567 foo", flags, Double::NaN(), &processed,
                  &all_used));
  CHECK_EQ(9, processed);

  CHECK_EQ(342391.0,
           StrToD("01234567e0", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(8, processed);

  CHECK_EQ(342391.0,
           StrToD("01234567e", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(8, processed);

  flags = StringToDoubleConverter::ALLOW_OCTALS |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_JUNK;
  CHECK_EQ(10.0, StrToD("012", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("00", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("012", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123456789.0,
           StrToD("0123456789", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("+01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("-01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD(" 012", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 00", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 0123456789", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" + 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" - 01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012 ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 00 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 012 ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 0123456789 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" + 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD(" - 01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(10.0, StrToD("012 ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("00 ", flags, 1.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123456789.0,
           StrToD("0123456789 ", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("01234567 ", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(342391.0,
           StrToD("+01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-342391.0,
           StrToD("-01234567", flags, Double::NaN(), &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(10.0, StrToD("012foo ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(3, processed);

  CHECK_EQ(0.0, StrToD("00foo ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(123456789.0,
           StrToD("0123456789foo ", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(10, processed);

  CHECK_EQ(342391.0,
           StrToD("01234567foo ", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(8, processed);

  CHECK_EQ(342391.0,
           StrToD("+01234567foo", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(9, processed);

  CHECK_EQ(-342391.0,
           StrToD("-01234567foo", flags, Double::NaN(), &processed, &all_used));
  CHECK_EQ(9, processed);

  CHECK_EQ(10.0, StrToD("012 foo ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(4, processed);

  CHECK_EQ(0.0, StrToD("00 foo ", flags, 1.0, &processed, &all_used));
  CHECK_EQ(3, processed);

  CHECK_EQ(123456789.0,
           StrToD("0123456789 foo ", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(11, processed);

  CHECK_EQ(342391.0,
           StrToD("01234567 foo ", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(9, processed);

  CHECK_EQ(342391.0,
           StrToD("+01234567 foo", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(10, processed);

  CHECK_EQ(-342391.0,
           StrToD("-01234567 foo", flags, Double::NaN(),
                  &processed, &all_used));
  CHECK_EQ(10, processed);
}